

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatchResultListener * __thiscall
testing::MatchResultListener::operator<<(MatchResultListener *this,Message *x)

{
  MatchResultListener *in_RDI;
  Message *in_stack_00000028;
  ostream *in_stack_00000030;
  
  if (in_RDI->stream_ != (ostream *)0x0) {
    testing::operator<<(in_stack_00000030,in_stack_00000028);
  }
  return in_RDI;
}

Assistant:

MatchResultListener& operator<<(const T& x) {
    if (stream_ != nullptr) *stream_ << x;
    return *this;
  }